

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdtext.c
# Opt level: O1

int cueify_cdtext_deserialize(cueify_cdtext *t,uint8_t *buffer,size_t size)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  ushort *puVar5;
  cueify_cdtext pvVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  void *pvVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  cueify_cdtext *ppvVar17;
  ulong uVar18;
  int size_00;
  long lVar19;
  byte *pbVar20;
  ushort uVar21;
  cueify_cdtext_private *cdtext;
  long lVar22;
  ulong uVar23;
  byte *pbVar24;
  long lVar25;
  ulong *__s;
  uchar *pack_data [8] [16];
  size_t pack_sizes [8] [16];
  cueify_cdtext *local_8c0;
  cueify_cdtext local_838 [128];
  ulong local_438 [129];
  
  iVar8 = 3;
  if (buffer != (uint8_t *)0x0 && t != (cueify_cdtext *)0x0) {
    iVar8 = 6;
    if ((3 < size) &&
       (uVar21 = *(ushort *)buffer << 8 | *(ushort *)buffer >> 8, iVar8 = 6,
       (ulong)uVar21 <= size - 2)) {
      uVar15 = (uint)uVar21 * 0x38e38e39 + 0x9c71c71c;
      iVar8 = 7;
      if ((uVar15 >> 1 | (uint)((uVar15 & 1) != 0) << 0x1f) < 0xe38e38f) {
        local_8c0 = local_838;
        memset(local_8c0,0,0x400);
        __s = local_438;
        memset(__s,0,0x400);
        ppvVar17 = t + 0x2be;
        lVar25 = 0;
        do {
          lVar22 = 0;
          do {
            free(*(void **)((long)ppvVar17 + lVar22 + -0x15e0));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -0x15e0) = 0;
            free(*(void **)((long)ppvVar17 + lVar22 + -0x12c0));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -0x12c0) = 0;
            free(*(void **)((long)ppvVar17 + lVar22 + -4000));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -4000) = 0;
            free(*(void **)((long)ppvVar17 + lVar22 + -0xc80));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -0xc80) = 0;
            free(*(void **)((long)ppvVar17 + lVar22 + -0x960));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -0x960) = 0;
            free(*(void **)((long)ppvVar17 + lVar22 + -0x640));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -0x640) = 0;
            free(*(void **)((long)ppvVar17 + lVar22 + -800));
            *(undefined8 *)((long)ppvVar17 + lVar22 + -800) = 0;
            free(*(void **)((long)ppvVar17 + lVar22));
            *(undefined8 *)((long)ppvVar17 + lVar22) = 0;
            pvVar10 = *(void **)((long)t + lVar22 + 0x1910);
            if (pvVar10 != (void *)0x0) {
              free(pvVar10);
              *(undefined8 *)((long)t + lVar22 + 0x1910) = 0;
            }
            pvVar10 = *(void **)((long)t + lVar22 + 0x1920);
            if (pvVar10 != (void *)0x0) {
              free(pvVar10);
              *(undefined8 *)((long)t + lVar22 + 0x1920) = 0;
            }
            lVar22 = lVar22 + 0x1928;
          } while (lVar22 != 0xc940);
          free(t[lVar25 + 0x195b]);
          t[lVar25 + 0x195b] = (cueify_cdtext)0x0;
          *(undefined1 *)((long)t + lVar25 + 0xca6e) = 0;
          lVar25 = lVar25 + 1;
          ppvVar17 = ppvVar17 + 1;
        } while (lVar25 != 100);
        pbVar20 = buffer + 4;
        pbVar24 = buffer + (int)(uVar21 - 2);
        pbVar9 = pbVar20;
        if (6 < uVar21) {
          do {
            if ((-1 < (char)pbVar9[1]) && ((char)*pbVar9 < -0x70)) {
              local_438[(ulong)(pbVar9[3] & 0x70) + (ulong)(*pbVar9 & 0xf)] =
                   local_438[(ulong)(pbVar9[3] & 0x70) + (ulong)(*pbVar9 & 0xf)] + 0xc;
            }
            pbVar9 = pbVar9 + 0x12;
          } while (pbVar9 < pbVar24);
        }
        lVar25 = 0;
        do {
          lVar22 = 0;
          do {
            if (__s[lVar22] != 0) {
              pvVar10 = malloc(__s[lVar22]);
              local_8c0[lVar22] = pvVar10;
              if (pvVar10 == (void *)0x0) goto LAB_0014ec2a;
              __s[lVar22] = 0;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x10);
          lVar25 = lVar25 + 1;
          __s = __s + 0x10;
          local_8c0 = local_8c0 + 0x10;
        } while (lVar25 != 8);
        pbVar9 = pbVar20;
        if (6 < uVar21) {
          do {
            if ((-1 < (char)pbVar9[1]) && ((char)*pbVar9 < -0x70)) {
              uVar23 = (ulong)((*pbVar9 & 0xf) << 3);
              uVar18 = (ulong)((pbVar9[3] & 0x70) << 3);
              lVar25 = *(long *)((long)local_838 + uVar23 + uVar18);
              lVar7 = uVar18 - 0x438;
              lVar22 = *(long *)((long)local_438 + uVar23 + lVar7 + 0x438);
              *(undefined4 *)(lVar25 + 8 + lVar22) = *(undefined4 *)(pbVar9 + 0xc);
              *(undefined8 *)(lVar25 + lVar22) = *(undefined8 *)(pbVar9 + 4);
              *(long *)((long)local_438 + uVar23 + lVar7 + 0x438) = lVar22 + 0xc;
            }
            pbVar9 = pbVar9 + 0x12;
          } while (pbVar9 < pbVar24);
        }
        pbVar9 = (byte *)((long)t + 0xc);
        lVar25 = 0x78;
        lVar22 = 0;
        do {
          if (*(long *)((long)local_438 + lVar25) == 0x24) {
            pbVar9[-0xc] = 1;
            pbVar9[-0xb] = 0;
            pbVar9[-10] = 0;
            pbVar9[-9] = 0;
            pbVar4 = *(byte **)((long)local_838 + lVar25);
            pbVar9[-8] = *pbVar4;
            pbVar9[-7] = pbVar4[lVar22 + 0x1c];
            pbVar9[-6] = pbVar4[1];
            pbVar9[-5] = pbVar4[2];
            pbVar9[-4] = pbVar4[3] >> 7;
            pbVar9[-3] = pbVar4[3] >> 6 & 1;
            pbVar9[-2] = pbVar4[3] >> 2 & 1;
            pbVar9[-1] = pbVar4[3] >> 1 & 1;
            *pbVar9 = pbVar4[3] & 1;
          }
          lVar22 = lVar22 + 1;
          pbVar9 = pbVar9 + 0x1928;
          lVar25 = lVar25 + 0x80;
        } while (lVar22 != 8);
        lVar25 = 0;
        do {
          lVar22 = lVar25 * 0x1928;
          uVar23 = 0;
          do {
            uVar18 = local_438[lVar25 * 0x10 + uVar23];
            if (uVar18 == 0) goto LAB_0014eadd;
            iVar8 = 0;
            size_00 = (int)uVar18;
            switch(uVar23 & 0xffffffff) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 0xd:
            case 0xe:
              bVar2 = *(byte *)((long)t + lVar22 + 4);
              if (1 < bVar2) {
                if (bVar2 == 0x80) {
                  pcVar11 = msjis_to_utf8((uint8_t *)local_838[lVar25 * 0x10 + uVar23],
                                          (int)(uVar18 >> 1));
                  goto LAB_0014e8e7;
                }
                pcVar11 = (char *)0x0;
LAB_0014e8f7:
                switch(uVar23 & 0xffffffff) {
                case 0:
                  local_8c0 = t + lVar25 * 0x325 + 2;
                  break;
                case 1:
                  local_8c0 = t + lVar25 * 0x325 + 0x66;
                  break;
                case 2:
                  local_8c0 = t + lVar25 * 0x325 + 0xca;
                  break;
                case 3:
                  local_8c0 = t + lVar25 * 0x325 + 0x12e;
                  break;
                case 4:
                  local_8c0 = t + lVar25 * 0x325 + 0x192;
                  break;
                case 5:
                  local_8c0 = t + lVar25 * 0x325 + 0x1f6;
                  break;
                case 0xd:
                  local_8c0 = t + lVar25 * 0x325 + 0x25a;
                  break;
                case 0xe:
                  local_8c0 = t + lVar25 * 0x325 + 0x2be;
                }
                if (pcVar11 != (char *)0x0) {
                  pcVar12 = strdup(pcVar11);
                  *local_8c0 = pcVar12;
                  if (pcVar12 == (char *)0x0) goto LAB_0014ead0;
                  bVar2 = *(byte *)((long)t + lVar22 + 6);
                  uVar18 = (ulong)bVar2;
                  bVar1 = *(byte *)((long)t + lVar22 + 7);
                  if (bVar2 <= bVar1) {
                    pcVar12 = pcVar11;
                    do {
                      sVar13 = strlen(pcVar12);
                      pcVar12 = pcVar12 + sVar13 + 1;
                      pcVar14 = strdup(pcVar12);
                      local_8c0[uVar18] = pcVar14;
                      if (pcVar14 == (char *)0x0) goto LAB_0014ead0;
                      uVar18 = uVar18 + 1;
                    } while ((ulong)bVar1 + 1 != uVar18);
                  }
                  free(pcVar11);
                }
                break;
              }
              pcVar11 = latin1_to_utf8((uint8_t *)local_838[lVar25 * 0x10 + uVar23],size_00);
LAB_0014e8e7:
              if (pcVar11 != (char *)0x0) goto LAB_0014e8f7;
LAB_0014ead0:
              iVar8 = 0x17;
              goto switchD_0014e8a2_default;
            case 6:
              pcVar11 = latin1_to_utf8((uint8_t *)local_838[lVar25 * 0x10 + uVar23],size_00);
              t[lVar25 * 0x325 + 0x322] = pcVar11;
              break;
            case 7:
              puVar5 = (ushort *)local_838[lVar25 * 0x10 + uVar23];
              uVar3 = *puVar5;
              *(ushort *)(t + lVar25 * 0x325 + 0x323) = uVar3 << 8 | uVar3 >> 8;
              pcVar11 = latin1_to_utf8((uint8_t *)(puVar5 + 1),size_00 + -2);
              t[lVar25 * 0x325 + 0x324] = pcVar11;
              break;
            case 8:
              pbVar9 = (byte *)local_838[lVar25 * 0x10 + uVar23];
              bVar2 = *pbVar9;
              *(byte *)(t + 0x1928) = bVar2;
              bVar1 = pbVar9[1];
              *(byte *)((long)t + 0xc941) = bVar1;
              *(byte *)((long)t + 0xc942) = pbVar9[3];
              *(byte *)((long)t + 0xc943) = pbVar9[4];
              *(byte *)((long)t + 0xc944) = pbVar9[5];
              if (bVar2 <= bVar1) {
                lVar16 = ((ulong)bVar1 - (ulong)bVar2) + 1;
                lVar7 = (ulong)bVar2 * 3;
                lVar19 = 0;
                do {
                  *(byte *)((long)t + lVar19 + lVar7 + 0xc942) = pbVar9[lVar19 + 0xc];
                  *(byte *)((long)t + lVar19 + lVar7 + 0xc943) = pbVar9[lVar19 + 0xd];
                  *(byte *)((long)t + lVar19 + lVar7 + 0xc944) = pbVar9[lVar19 + 0xe];
                  lVar19 = lVar19 + 3;
                  lVar16 = lVar16 + -1;
                } while (lVar16 != 0);
              }
              break;
            case 9:
            case 10:
            case 0xb:
            case 0xc:
              break;
            default:
              goto switchD_0014e8a2_default;
            }
            iVar8 = 0;
switchD_0014e8a2_default:
            if (iVar8 != 0) {
              if (iVar8 != 0x17) {
                return iVar8;
              }
              goto LAB_0014ec2a;
            }
LAB_0014eadd:
            uVar23 = uVar23 + 1;
          } while (uVar23 != 0x10);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 8);
        if (6 < uVar21) {
          do {
            lVar25 = (long)(char)pbVar20[1];
            if ((-1 < lVar25) && (*pbVar20 == 0x89)) {
              bVar2 = pbVar20[5];
              *(byte *)((long)t + lVar25 + 0xca6e) = bVar2;
              if (t[lVar25 + 0x195b] == (cueify_cdtext)0x0) {
                pvVar10 = malloc((ulong)((uint)bVar2 * 2) * 3);
                t[lVar25 + 0x195b] = pvVar10;
                if (pvVar10 == (void *)0x0) {
LAB_0014ec2a:
                  ppvVar17 = local_838;
                  lVar25 = 0;
                  do {
                    lVar22 = 0;
                    do {
                      free(ppvVar17[lVar22]);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0x10);
                    lVar25 = lVar25 + 1;
                    ppvVar17 = ppvVar17 + 0x10;
                  } while (lVar25 != 8);
                  return 4;
                }
              }
              pvVar6 = t[lVar25 + 0x195b];
              *(byte *)((long)pvVar6 + (ulong)pbVar20[4] * 6 + -6) = pbVar20[10];
              *(byte *)((long)pvVar6 + (ulong)pbVar20[4] * 6 + -5) = pbVar20[0xb];
              *(byte *)((long)pvVar6 + (ulong)pbVar20[4] * 6 + -4) = pbVar20[0xc];
              *(byte *)((long)pvVar6 + (ulong)pbVar20[4] * 6 + -3) = pbVar20[0xd];
              *(byte *)((long)pvVar6 + (ulong)pbVar20[4] * 6 + -2) = pbVar20[0xe];
              *(byte *)((long)pvVar6 + (ulong)pbVar20[4] * 6 + -1) = pbVar20[0xf];
            }
            pbVar20 = pbVar20 + 0x12;
          } while (pbVar20 < pbVar24);
        }
        ppvVar17 = local_838;
        lVar25 = 0;
        do {
          lVar22 = 0;
          do {
            free(ppvVar17[lVar22]);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x10);
          lVar25 = lVar25 + 1;
          ppvVar17 = ppvVar17 + 0x10;
          iVar8 = 0;
        } while (lVar25 != 8);
      }
    }
  }
  return iVar8;
}

Assistant:

int cueify_cdtext_deserialize(cueify_cdtext *t, const uint8_t * const buffer,
			      size_t size) {
    cueify_cdtext_private *cdtext = (cueify_cdtext_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    int block, pack_type, track;
    unsigned char *pack_data[MAX_BLOCKS][16];
    unsigned char *pack;
    size_t pack_sizes[MAX_BLOCKS][16];
    size_t pack_size;
    struct cdtext_descriptor *descriptor;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* CD-TEXT Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 18 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    /* Reserved */

    /* Zero out the pack data. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    pack_data[block][pack_type] = NULL;
	    pack_sizes[block][pack_type] = 0;
	}
    }

    /* Zero out the cdtext data (so it can be freed) */
    for (track = 0; track < MAX_TRACKS; track++) {
	for (block = 0; block < MAX_BLOCKS; block++) {
	    free(cdtext->blocks[block].titles[track]);
	    cdtext->blocks[block].titles[track] = NULL;
	    free(cdtext->blocks[block].performers[track]);
	    cdtext->blocks[block].performers[track] = NULL;
	    free(cdtext->blocks[block].songwriters[track]);
	    cdtext->blocks[block].songwriters[track] = NULL;
	    free(cdtext->blocks[block].composers[track]);
	    cdtext->blocks[block].composers[track] = NULL;
	    free(cdtext->blocks[block].arrangers[track]);
	    cdtext->blocks[block].arrangers[track] = NULL;
	    free(cdtext->blocks[block].messages[track]);
	    cdtext->blocks[block].messages[track] = NULL;
	    free(cdtext->blocks[block].private[track]);
	    cdtext->blocks[block].private[track] = NULL;
	    free(cdtext->blocks[block].upc_isrcs[track]);
	    cdtext->blocks[block].upc_isrcs[track] = NULL;
	    if (cdtext->blocks[block].discid != NULL) {
		free(cdtext->blocks[block].discid);
		cdtext->blocks[block].discid = NULL;
	    }
	    if (cdtext->blocks[block].genre_name != NULL) {
		free(cdtext->blocks[block].genre_name);
		cdtext->blocks[block].genre_name = NULL;
	    }
	}

	free(cdtext->toc.intervals[track]);
	cdtext->toc.intervals[track] = NULL;
	cdtext->toc.num_intervals[track] = 0;
    }

    /* Count all of the PACKs by BLOCK, so we know how much space to
     * allocate. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	pack_sizes[BLOCK_NUMBER(descriptor->block_number)]
	    [descriptor->pack_type - 0x80] += 12;
    }

    /* Allocate the aggregate PACK space. */
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		pack_data[block][pack_type] =
		    malloc(pack_sizes[block][pack_type]);
		if (pack_data[block][pack_type] == NULL) {
		    goto error;
		}
		/* Reset the size count, so that we can use it as a pointer. */
		pack_sizes[block][pack_type] = 0;
	    }
	}
    }

    /* Aggregate all PACKs. */
    /* NOTE: We assume that PACKs in a given PACK type are in order!! */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type - 0x80;

	pack = pack_data[block][pack_type];
	pack_size = pack_sizes[block][pack_type];
	memcpy(pack + pack_size, descriptor->data, 12);
	pack_sizes[block][pack_type] += 12;
	/* TODO: Check CRC */
    }

    /*
     * Now that we have collected all of the PACKs by BLOCK and type,
     * parse the size information PACKs to get the character code,
     * track, and language code info.
     */
    for (block = 0; block < MAX_BLOCKS; block++) {
	/* Don't know how to handle any other size of the size
	 * information block! */
	if (pack_sizes[block][15] != 36) {
	    continue;
	}

	cdtext->blocks[block].valid = 1;
	cdtext->blocks[block].charset = pack_data[block][15][0];
	/* NOTE: This might not work if the language codes aren't in
	 * EVERY info block */
	cdtext->blocks[block].language = pack_data[block][15][block + 28];
	cdtext->blocks[block].first_track_number = pack_data[block][15][1];
	cdtext->blocks[block].last_track_number = pack_data[block][15][2];
	cdtext->blocks[block].program_cdtext =
	    (pack_data[block][15][3] >> 7) & 1;
	cdtext->blocks[block].program_copyright =
	    (pack_data[block][15][3] >> 6) & 1;
	cdtext->blocks[block].message_copyright =
	    (pack_data[block][15][3] >> 2) & 1;
	cdtext->blocks[block].name_copyright =
	    (pack_data[block][15][3] >> 1) & 1;
	cdtext->blocks[block].title_copyright =
	    (pack_data[block][15][3]) & 1;
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    if (pack_sizes[block][pack_type] > 0) {
		char **datum;
		char *data = NULL, *data_ptr = NULL;

		switch (pack_type) {
		case 0:   /* 0x80 = TITLE */
		case 1:   /* 0x81 = PERFORMER */
		case 2:   /* 0x82 = SONGWRITER */
		case 3:   /* 0x83 = COMPOSER */
		case 4:   /* 0x84 = ARRANGER */
		case 5:   /* 0x85 = MESSAGE */
		case 13:  /* 0x8D = PRIVATE */
		case 14:  /* 0x8E = UPC/ISRC */
		    /* Textual track-wise PACKs. */

		    /* Decode the PACK contents. */
		    data = NULL;
		    switch (cdtext->blocks[block].charset) {
		    case CUEIFY_CDTEXT_CHARSET_ASCII:
		    case CUEIFY_CDTEXT_CHARSET_ISO8859_1:
			data = latin1_to_utf8(pack_data[block][pack_type],
					      pack_sizes[block][pack_type]);
			if (data == NULL) {
			    goto error;
			}
			break;
		    case CUEIFY_CDTEXT_CHARSET_MSJIS:
			/* NOTE: MS-JIS is a two-byte encoding. */
			data = msjis_to_utf8(pack_data[block][pack_type],
					     pack_sizes[block][pack_type] / 2);
			if (data == NULL) {
			    goto error;
			}
			break;
		    default:
			/* Ignore! */
			break;
		    }

		    /* Split data by track. */
		    switch (pack_type) {
		    case 0:   /* 0x80 = TITLE */
			datum = cdtext->blocks[block].titles;
			break;
		    case 1:   /* 0x81 = PERFORMER */
			datum = cdtext->blocks[block].performers;
			break;
		    case 2:   /* 0x82 = SONGWRITER */
			datum = cdtext->blocks[block].songwriters;
			break;
		    case 3:   /* 0x83 = COMPOSER */
			datum = cdtext->blocks[block].composers;
			break;
		    case 4:   /* 0x84 = ARRANGER */
			datum = cdtext->blocks[block].arrangers;
			break;
		    case 5:   /* 0x85 = MESSAGE */
			datum = cdtext->blocks[block].messages;
			break;
		    /* NOTE: 0x8D/0x8E probably break in MS-JIS!! */
		    case 13:  /* 0x8D = PRIVATE */
			datum = cdtext->blocks[block].private;
			break;
		    case 14:  /* 0x8E = UPC/ISRC */
			datum = cdtext->blocks[block].upc_isrcs;
			break;
		    default:
			break;
		    }

		    /* Copy the decoded text */
		    /* NOTE: This is probably broken for things which
		     * skip tracks. */
		    if (data != NULL) {
			data_ptr = data;
			/* First do the album-wide value. */
			datum[0] = strdup(data_ptr);
			if (datum[0] == NULL) {
			    /* Failed to strdup */
			    goto error;
			}
			/* NOTE: We assume all tracks are included! */
			for (track = cdtext->blocks[block].first_track_number;
			     track <= cdtext->blocks[block].last_track_number;
			     track++) {
			    /* Skip to next track entry. */
			    data_ptr += strlen(data_ptr) + 1;
			    datum[track] = strdup(data_ptr);
			    if (datum[track] == NULL) {
				/* Failed to strdup */
				goto error;
			    }
			}

			/* All done with the decoded value. We can free it. */
			free(data);
		    }
		    break;
		case 6:   /* 0x86 = DISCID */
		    /* According to Red Book, only ISO 8859-1 may be used. */
		    cdtext->blocks[block].discid =
			latin1_to_utf8(pack_data[block][pack_type],
				       pack_sizes[block][pack_type]);
		    break;
		case 7:   /* 0x87 = GENRE */
		    /* Genre includes a genre code in addition to text. */
		    cdtext->blocks[block].genre_code =
			((uint16_t)pack_data[block][pack_type][0] << 8) |
			((uint16_t)pack_data[block][pack_type][1]);
		    /* No particular reason to believe this is Latin1 only?? */
		    cdtext->blocks[block].genre_name =
			latin1_to_utf8(pack_data[block][pack_type] + 2,
				       pack_sizes[block][pack_type] - 2);
		    break;
		case 8:   /* 0x88 = TOCINFO */
		    /* This basically encodes another (short) TOC. */
		    /* NOTE: We assume that the TOC only occurs once. */
		    cdtext->toc.first_track_number =
			pack_data[block][pack_type][0];
		    cdtext->toc.last_track_number =
			pack_data[block][pack_type][1];
		    cdtext->toc.offsets[0].min =
			pack_data[block][pack_type][3];
		    cdtext->toc.offsets[0].sec =
			pack_data[block][pack_type][4];
		    cdtext->toc.offsets[0].frm =
			pack_data[block][pack_type][5];
		    /* NOTE: We assume that the tracks are contiguous
		     * in increasing order. */
		    for (track = cdtext->toc.first_track_number;
			 track <= cdtext->toc.last_track_number;
			 track++) {
			cdtext->toc.offsets[track].min =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3];
			cdtext->toc.offsets[track].sec =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+1];
			cdtext->toc.offsets[track].frm =
			    pack_data[block][pack_type]
			    [12+(track - cdtext->toc.first_track_number)*3+2];
		    }
		    break;
		case 9:   /* 0x89 = TOCINFO2 */
		    /* Need the track number from the PACK, so we
		     * ignore and handle later. */
		case 15:  /* 0x8F = SIZEINFO */
		default:
		    /* Ignore! */
		    break;
		}
	    }
	}
    }

    /* Finally, we go back and do the TOCINFO2 packets. */
    for (bp = buffer + 4; bp < buffer + (toc_length - 2); bp += 18) {
	descriptor = (struct cdtext_descriptor *)bp;

	/* Ignore extension blocks. */
	if (EXTENSION_FLAG(descriptor->track_number) ||
	    descriptor->pack_type < 0x80 ||
	    descriptor->pack_type > 0x8F) {
	    continue;
	}

	block = BLOCK_NUMBER(descriptor->block_number);
	pack_type = descriptor->pack_type;

	/* NOTE: We assume that the TOC-2 only occurs once. */
	if (pack_type == 0x89) {
	    track = TRACK_NUMBER(descriptor->track_number);

	    cdtext->toc.num_intervals[track] = descriptor->data[1];
	    if (cdtext->toc.intervals[track] == NULL) {
		cdtext->toc.intervals[track] =
		    malloc(cdtext->toc.num_intervals[track] *
			   sizeof(cueify_cdtext_toc_track_interval_private));
		if (cdtext->toc.intervals[track] == NULL) {
		    goto error;
		}
	    }

	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.min =
		descriptor->data[6];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.sec =
		descriptor->data[7];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].start.frm =
		descriptor->data[8];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.min =
		descriptor->data[9];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.sec =
		descriptor->data[10];
	    cdtext->toc.intervals[track][descriptor->data[0] - 1].end.frm =
		descriptor->data[11];
	}
    }

    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    return CUEIFY_OK;

error:
    for (block = 0; block < MAX_BLOCKS; block++) {
	for (pack_type = 0; pack_type < 16; pack_type++) {
	    free(pack_data[block][pack_type]);
	}
    }

    /* Almost always a memory error. */
    return CUEIFY_ERR_NOMEM;
}